

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<FunctionCallStatementNode,_std::default_delete<FunctionCallStatementNode>_> __thiscall
Parser::parseLambdaCallStatement(Parser *this)

{
  Mark MVar1;
  Mark *pMVar2;
  istream *piVar3;
  pointer *__ptr;
  Stream *in_RSI;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> lambdaCall;
  istream *local_48;
  string local_40;
  
  pMVar2 = Stream::getMark(in_RSI);
  MVar1 = *pMVar2;
  parseLambdaCall((Parser *)&local_48,SUB81(in_RSI,0));
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Expected semicolon!","");
  expectToken((Parser *)in_RSI,Semicolon,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._0_8_ + 1);
  }
  piVar3 = (istream *)operator_new(0x18);
  *(undefined8 *)(piVar3 + 8) = 1;
  *(undefined ***)piVar3 = &PTR__FunctionCallStatementNode_001f4f10;
  *(istream **)(piVar3 + 0x10) = local_48;
  (this->tokenizer_).stream_.is_ = piVar3;
  *(Mark *)(piVar3 + 8) = MVar1;
  return (__uniq_ptr_data<FunctionCallStatementNode,_std::default_delete<FunctionCallStatementNode>,_true,_true>
          )(__uniq_ptr_data<FunctionCallStatementNode,_std::default_delete<FunctionCallStatementNode>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FunctionCallStatementNode> Parser::parseLambdaCallStatement()
{
  const auto mark = tokenizer_.getMark();
  auto lambdaCall = parseLambdaCall();
  expectToken(TokenType::Semicolon, "Expected semicolon!");
  auto node = std::make_unique<FunctionCallStatementNode>(std::move(lambdaCall));
  node->setMark(mark);
  return node;
}